

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O0

int jpc_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  int iVar1;
  jpc_ms_t *pjVar2;
  jpc_enc_cp_t *local_38;
  jpc_enc_cp_t *cp;
  jpc_enc_t *enc;
  char *optstr_local;
  jas_stream_t *out_local;
  jas_image_t *image_local;
  
  cp = (jpc_enc_cp_t *)0x0;
  jpc_initluts();
  local_38 = cp_create(optstr,image);
  if (local_38 == (jpc_enc_cp_t *)0x0) {
    jas_eprintf("invalid JP encoder options\n");
  }
  else {
    cp = (jpc_enc_cp_t *)jpc_enc_create(local_38,out,image);
    if (cp == (jpc_enc_cp_t *)0x0) {
      jas_eprintf("jpc_enc_create failed\n");
    }
    else {
      local_38 = (jpc_enc_cp_t *)0x0;
      iVar1 = jpc_enc_encodemainhdr((jpc_enc_t *)cp);
      if (iVar1 == 0) {
        iVar1 = jpc_enc_encodemainbody((jpc_enc_t *)cp);
        if (iVar1 == 0) {
          pjVar2 = jpc_ms_create(0xffd9);
          cp->tilewidth = (uint_fast32_t)pjVar2;
          if (pjVar2 == (jpc_ms_t *)0x0) {
            jas_eprintf("cannot create EOC marker\n");
          }
          else {
            iVar1 = jpc_putms((jas_stream_t *)cp->imgareatlx,(jpc_cstate_t *)cp->refgrdheight,
                              (jpc_ms_t *)cp->tilewidth);
            if (iVar1 == 0) {
              jpc_ms_destroy((jpc_ms_t *)cp->tilewidth);
              cp->tilewidth = 0;
              iVar1 = jas_stream_flush((jas_stream_t *)cp->imgareatlx);
              if (iVar1 == 0) {
                jpc_enc_destroy((jpc_enc_t *)cp);
                return 0;
              }
              jas_eprintf("stream flush failed\n");
            }
            else {
              jas_eprintf("cannot write EOC marker\n");
            }
          }
        }
        else {
          jas_eprintf("cannot encode main body\n");
        }
      }
      else {
        jas_eprintf("cannot encode main header\n");
      }
    }
  }
  if (local_38 != (jpc_enc_cp_t *)0x0) {
    jpc_enc_cp_destroy(local_38);
  }
  if (cp != (jpc_enc_cp_t *)0x0) {
    jpc_enc_destroy((jpc_enc_t *)cp);
  }
  jas_eprintf("jpc_encode failed\n");
  return -1;
}

Assistant:

int jpc_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	jpc_enc_t *enc;
	jpc_enc_cp_t *cp;

	enc = 0;
	cp = 0;

	jpc_initluts();

	if (!(cp = cp_create(optstr, image))) {
		jas_eprintf("invalid JP encoder options\n");
		goto error;
	}

	if (!(enc = jpc_enc_create(cp, out, image))) {
		jas_eprintf("jpc_enc_create failed\n");
		goto error;
	}
	cp = 0;

	/* Encode the main header. */
	if (jpc_enc_encodemainhdr(enc)) {
		jas_eprintf("cannot encode main header\n");
		goto error;
	}

	/* Encode the main body.  This constitutes most of the encoding work. */
	if (jpc_enc_encodemainbody(enc)) {
		jas_eprintf("cannot encode main body\n");
		goto error;
	}

	/* Write EOC marker segment. */
	if (!(enc->mrk = jpc_ms_create(JPC_MS_EOC))) {
		jas_eprintf("cannot create EOC marker\n");
		goto error;
	}
	if (jpc_putms(enc->out, enc->cstate, enc->mrk)) {
		jas_eprintf("cannot write EOC marker\n");
		goto error;
	}
	jpc_ms_destroy(enc->mrk);
	enc->mrk = 0;

	if (jas_stream_flush(enc->out)) {
		jas_eprintf("stream flush failed\n");
		goto error;
	}

	jpc_enc_destroy(enc);

	return 0;

error:
	if (cp) {
		jpc_enc_cp_destroy(cp);
	}
	if (enc) {
		jpc_enc_destroy(enc);
	}
	jas_eprintf("jpc_encode failed\n");
	return -1;
}